

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::M3DImporter::populateMesh
          (M3DImporter *this,M3DWrapper *m3d,aiMesh *pMesh,
          vector<aiFace,_std::allocator<aiFace>_> *faces,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *texcoords,
          vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vertexids)

{
  char *pcVar1;
  aiNode *pNode_00;
  m3dv_t *pmVar2;
  m3db_t *pmVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  bool bVar12;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar13;
  m3d_t *pmVar14;
  basic_formatter *this_01;
  size_type sVar15;
  ulong uVar16;
  ulong *puVar17;
  pointer paVar18;
  size_type sVar19;
  aiColor4t<float> *paVar20;
  ulong uVar21;
  aiBone *this_02;
  reference pvVar22;
  aiVertexWeight *paVar23;
  aiFace *paVar24;
  ulong uVar25;
  aiVertexWeight *local_1510;
  aiColor4t<float> *local_1490;
  pointer local_1460;
  pointer local_1430;
  pointer local_1400;
  aiFace *local_13d8;
  aiBone *pBone_1;
  string local_1348;
  undefined1 local_1324 [8];
  aiString name_1;
  uint k_1;
  uint s_1;
  aiBone *pBone;
  string local_f08;
  undefined1 local_ee4 [8];
  aiString name;
  uint k;
  uint s;
  uint j;
  uint i_1;
  aiString local_a90;
  allocator<char> local_689;
  string local_688;
  aiString local_664;
  aiNode *local_260;
  aiNode *pNode;
  iterator iStack_250;
  uint i;
  __normal_iterator<aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_248;
  aiVector3t<float> *local_240;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_238;
  aiVector3t<float> *local_230;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_228;
  aiVector3t<float> *local_220;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_218;
  aiFace *local_210;
  __normal_iterator<aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_> local_208;
  size_type local_200;
  size_type local_1f8;
  size_type local_1f0 [3];
  size_type local_1d8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_58;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_38;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices_local;
  vector<aiFace,_std::allocator<aiFace>_> *faces_local;
  aiMesh *pMesh_local;
  M3DWrapper *m3d_local;
  M3DImporter *this_local;
  
  local_38 = normals;
  normals_local = vertices;
  vertices_local = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)faces;
  faces_local = (vector<aiFace,_std::allocator<aiFace>_> *)pMesh;
  pMesh_local = (aiMesh *)m3d;
  m3d_local = (M3DWrapper *)this;
  if (pMesh == (aiMesh *)0x0) {
    __assert_fail("pMesh != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29c,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (faces == (vector<aiFace,_std::allocator<aiFace>_> *)0x0) {
    __assert_fail("faces != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29d,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (vertices == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("vertices != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29e,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (normals == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("normals != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29f,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (texcoords == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("texcoords != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a0,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (colors == (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)0x0) {
    __assert_fail("colors != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a1,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (vertexids == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    __assert_fail("vertexids != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a2,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  bVar12 = M3DWrapper::operator_cast_to_bool(m3d);
  if (!bVar12) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a3,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[31]>(&local_1d0,(char (*) [31])"M3D: populateMesh numvertices ");
  local_1d8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        (normals_local);
  pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1d0,&local_1d8);
  pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar13,(char (*) [11])" numfaces ");
  local_1f0[0] = std::vector<aiFace,_std::allocator<aiFace>_>::size
                           ((vector<aiFace,_std::allocator<aiFace>_> *)vertices_local);
  pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar13,local_1f0);
  pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar13,(char (*) [13])" numnormals ");
  local_1f8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(local_38);
  pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar13,&local_1f8);
  pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar13,(char (*) [14])" numtexcoord ");
  local_200 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(texcoords);
  pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar13,&local_200);
  pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar13,(char (*) [11])" numbones ");
  pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
  this_01 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar13,&pmVar14->numbone);
  Formatter::basic_formatter::operator_cast_to_string(&local_58,this_01);
  Logger::debug(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1d0);
  sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(normals_local);
  if ((sVar15 != 0) &&
     (sVar15 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                         ((vector<aiFace,_std::allocator<aiFace>_> *)vertices_local), sVar15 != 0))
  {
    sVar15 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                       ((vector<aiFace,_std::allocator<aiFace>_> *)vertices_local);
    *(int *)&(faces_local->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
             super__Vector_impl_data._M_finish = (int)sVar15;
    uVar21 = CONCAT44(0,*(uint *)&(faces_local->super__Vector_base<aiFace,_std::allocator<aiFace>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar21;
    uVar16 = SUB168(auVar5 * ZEXT816(0x10),0);
    uVar25 = uVar16 + 8;
    if (SUB168(auVar5 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar16) {
      uVar25 = 0xffffffffffffffff;
    }
    puVar17 = (ulong *)operator_new__(uVar25);
    *puVar17 = uVar21;
    paVar24 = (aiFace *)(puVar17 + 1);
    if (uVar21 != 0) {
      local_13d8 = paVar24;
      do {
        aiFace::aiFace(local_13d8);
        local_13d8 = local_13d8 + 1;
      } while (local_13d8 != paVar24 + uVar21);
    }
    faces_local[8].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = paVar24;
    local_208._M_current =
         (aiFace *)
         std::vector<aiFace,_std::allocator<aiFace>_>::begin
                   ((vector<aiFace,_std::allocator<aiFace>_> *)vertices_local);
    local_210 = (aiFace *)
                std::vector<aiFace,_std::allocator<aiFace>_>::end
                          ((vector<aiFace,_std::allocator<aiFace>_> *)vertices_local);
    std::
    copy<__gnu_cxx::__normal_iterator<aiFace*,std::vector<aiFace,std::allocator<aiFace>>>,aiFace*>
              (local_208,
               (__normal_iterator<aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_>)local_210
               ,faces_local[8].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       (normals_local);
    *(int *)((long)&(faces_local->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                    super__Vector_impl_data._M_start + 4) = (int)sVar15;
    uVar21 = CONCAT44(0,*(uint *)((long)&(faces_local->
                                         super__Vector_base<aiFace,_std::allocator<aiFace>_>).
                                         _M_impl.super__Vector_impl_data._M_start + 4));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar21;
    uVar16 = SUB168(auVar6 * ZEXT816(0xc),0);
    if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
      uVar16 = 0xffffffffffffffff;
    }
    paVar18 = (pointer)operator_new__(uVar16);
    if (uVar21 != 0) {
      local_1400 = paVar18;
      do {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_1400);
        local_1400 = (pointer)((long)&local_1400->mIndices + 4);
      } while (local_1400 != (pointer)(&paVar18->mNumIndices + uVar21 * 3));
    }
    (faces_local->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = paVar18;
    local_218._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(normals_local);
    local_220 = (aiVector3t<float> *)
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                          (normals_local);
    std::
    copy<__gnu_cxx::__normal_iterator<aiVector3t<float>*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
              (local_218,
               (__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                )local_220,
               (aiVector3t<float> *)
               (faces_local->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(local_38);
    sVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       (normals_local);
    if (sVar15 == sVar19) {
      uVar21 = CONCAT44(0,*(uint *)((long)&(faces_local->
                                           super__Vector_base<aiFace,_std::allocator<aiFace>_>).
                                           _M_impl.super__Vector_impl_data._M_start + 4));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar21;
      uVar16 = SUB168(auVar7 * ZEXT816(0xc),0);
      if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
        uVar16 = 0xffffffffffffffff;
      }
      paVar18 = (pointer)operator_new__(uVar16);
      if (uVar21 != 0) {
        local_1430 = paVar18;
        do {
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_1430);
          local_1430 = (pointer)((long)&local_1430->mIndices + 4);
        } while (local_1430 != (pointer)(&paVar18->mNumIndices + uVar21 * 3));
      }
      faces_local[1].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
      super__Vector_impl_data._M_start = paVar18;
      local_228._M_current =
           (aiVector3t<float> *)
           std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(local_38);
      local_230 = (aiVector3t<float> *)
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(local_38)
      ;
      std::
      copy<__gnu_cxx::__normal_iterator<aiVector3t<float>*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
                (local_228,
                 (__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                  )local_230,
                 (aiVector3t<float> *)
                 faces_local[1].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(texcoords);
    sVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       (normals_local);
    if (sVar15 == sVar19) {
      uVar21 = CONCAT44(0,*(uint *)((long)&(faces_local->
                                           super__Vector_base<aiFace,_std::allocator<aiFace>_>).
                                           _M_impl.super__Vector_impl_data._M_start + 4));
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar21;
      uVar16 = SUB168(auVar8 * ZEXT816(0xc),0);
      if (SUB168(auVar8 * ZEXT816(0xc),8) != 0) {
        uVar16 = 0xffffffffffffffff;
      }
      paVar18 = (pointer)operator_new__(uVar16);
      if (uVar21 != 0) {
        local_1460 = paVar18;
        do {
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_1460);
          local_1460 = (pointer)((long)&local_1460->mIndices + 4);
        } while (local_1460 != (pointer)(&paVar18->mNumIndices + uVar21 * 3));
      }
      faces_local[4].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = paVar18;
      local_238._M_current =
           (aiVector3t<float> *)
           std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(texcoords);
      local_240 = (aiVector3t<float> *)
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                            (texcoords);
      std::
      copy<__gnu_cxx::__normal_iterator<aiVector3t<float>*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
                (local_238,
                 (__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                  )local_240,
                 (aiVector3t<float> *)
                 faces_local[4].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      *(undefined4 *)
       &faces_local[7].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
        super__Vector_impl_data._M_finish = 2;
    }
    sVar15 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size(colors);
    sVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       (normals_local);
    if (sVar15 == sVar19) {
      uVar21 = CONCAT44(0,*(uint *)((long)&(faces_local->
                                           super__Vector_base<aiFace,_std::allocator<aiFace>_>).
                                           _M_impl.super__Vector_impl_data._M_start + 4));
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar21;
      uVar16 = SUB168(auVar9 * ZEXT816(0x10),0);
      if (SUB168(auVar9 * ZEXT816(0x10),8) != 0) {
        uVar16 = 0xffffffffffffffff;
      }
      paVar20 = (aiColor4t<float> *)operator_new__(uVar16);
      if (uVar21 != 0) {
        local_1490 = paVar20;
        do {
          aiColor4t<float>::aiColor4t(local_1490);
          local_1490 = local_1490 + 1;
        } while (local_1490 != paVar20 + uVar21);
      }
      faces_local[2].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)paVar20;
      local_248._M_current =
           (aiColor4t<float> *)
           std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::begin(colors);
      iStack_250 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::end(colors);
      std::
      copy<__gnu_cxx::__normal_iterator<aiColor4t<float>*,std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>>,aiColor4t<float>*>
                (local_248,
                 (__normal_iterator<aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                  )iStack_250._M_current,
                 (aiColor4t<float> *)
                 faces_local[2].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
    *(M3D_INDEX *)
     &faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
      super__Vector_impl_data._M_start = pmVar14->numbone;
    if (*(int *)&faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                 super__Vector_impl_data._M_start != 0) {
      auVar5 = ZEXT416(*(uint *)&faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                 _M_impl.super__Vector_impl_data._M_start) * ZEXT816(8);
      uVar21 = auVar5._0_8_;
      if (auVar5._8_8_ != 0) {
        uVar21 = 0xffffffffffffffff;
      }
      paVar18 = (pointer)operator_new__(uVar21);
      faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
      super__Vector_impl_data._M_finish = paVar18;
      for (pNode._4_4_ = 0; uVar11 = pNode._4_4_,
          pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local), uVar11 < pmVar14->numbone;
          pNode._4_4_ = pNode._4_4_ + 1) {
        this_02 = (aiBone *)operator_new(0x460);
        aiBone::aiBone(this_02);
        *(aiBone **)
         (&(faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
            super__Vector_impl_data._M_finish)->mNumIndices + (ulong)pNode._4_4_ * 2) = this_02;
        pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
        pcVar1 = pmVar14->bone[pNode._4_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,pcVar1,&local_689);
        aiString::aiString(&local_664,&local_688);
        aiString::operator=(*(aiString **)
                             (&(faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                _M_impl.super__Vector_impl_data._M_finish)->mNumIndices +
                             (ulong)pNode._4_4_ * 2),&local_664);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator(&local_689);
        *(undefined4 *)
         (*(long *)(&(faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                      super__Vector_impl_data._M_finish)->mNumIndices + (ulong)pNode._4_4_ * 2) +
         0x404) = 0;
        pNode_00 = this->mScene->mRootNode;
        aiString::aiString(&local_a90,
                           *(aiString **)
                            (&(faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                               _M_impl.super__Vector_impl_data._M_finish)->mNumIndices +
                            (ulong)pNode._4_4_ * 2));
        local_260 = findNode(this,pNode_00,&local_a90);
        if (local_260 == (aiNode *)0x0) {
          aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&j);
          memcpy((void *)(*(long *)(&(faces_local[9].
                                      super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                      super__Vector_impl_data._M_finish)->mNumIndices +
                                   (ulong)pNode._4_4_ * 2) + 0x420),&j,0x40);
        }
        else {
          calculateOffsetMatrix
                    (this,local_260,
                     (aiMatrix4x4 *)
                     (*(long *)(&(faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->mNumIndices +
                               (ulong)pNode._4_4_ * 2) + 0x420));
          aiMatrix4x4t<float>::Inverse
                    ((aiMatrix4x4t<float> *)
                     (*(long *)(&(faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->mNumIndices +
                               (ulong)pNode._4_4_ * 2) + 0x420));
        }
      }
      sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(vertexids);
      if (sVar15 != 0) {
        for (s = 0; sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                       (vertexids), s < sVar15; s = s + 1) {
          pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
          pmVar2 = pmVar14->vertex;
          pvVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(vertexids,(ulong)s)
          ;
          name.data._1020_4_ = pmVar2[*pvVar22].skinid;
          if ((name.data._1020_4_ != 0xffffffff) && (name.data._1020_4_ != 0xfffffffe)) {
            name.data[0x3f8] = '\0';
            name.data[0x3f9] = '\0';
            name.data[0x3fa] = '\0';
            name.data[0x3fb] = '\0';
            while( true ) {
              bVar12 = false;
              if ((uint)name.data._1016_4_ < 4) {
                pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
                bVar12 = 0.0 < pmVar14->skin[(uint)name.data._1020_4_].weight
                               [(uint)name.data._1016_4_];
              }
              if (!bVar12) break;
              pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
              pmVar3 = pmVar14->bone;
              pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
              pcVar1 = pmVar3[pmVar14->skin[(uint)name.data._1020_4_].boneid
                              [(uint)name.data._1016_4_]].name;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f08,pcVar1,(allocator<char> *)((long)&pBone + 7));
              aiString::aiString((aiString *)local_ee4,&local_f08);
              std::__cxx11::string::~string((string *)&local_f08);
              std::allocator<char>::~allocator((allocator<char> *)((long)&pBone + 7));
              for (k = 0; k < *(uint *)&faces_local[9].
                                        super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                        super__Vector_impl_data._M_start; k = k + 1) {
                bVar12 = aiString::operator==
                                   (*(aiString **)
                                     (&(faces_local[9].
                                        super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                        super__Vector_impl_data._M_finish)->mNumIndices +
                                     (ulong)k * 2),(aiString *)local_ee4);
                if (bVar12) {
                  lVar4 = *(long *)(&(faces_local[9].
                                      super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                      super__Vector_impl_data._M_finish)->mNumIndices + (ulong)k * 2
                                   );
                  *(int *)(lVar4 + 0x404) = *(int *)(lVar4 + 0x404) + 1;
                  break;
                }
              }
              name.data._1016_4_ = name.data._1016_4_ + 1;
            }
          }
        }
        for (k = 0; k < *(uint *)&faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>
                                  ._M_impl.super__Vector_impl_data._M_start; k = k + 1) {
          lVar4 = *(long *)(&(faces_local[9].super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                              _M_impl.super__Vector_impl_data._M_finish)->mNumIndices + (ulong)k * 2
                           );
          if (*(int *)(lVar4 + 0x404) != 0) {
            uVar21 = CONCAT44(0,*(uint *)(lVar4 + 0x404));
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar21;
            uVar16 = SUB168(auVar10 * ZEXT816(8),0);
            if (SUB168(auVar10 * ZEXT816(8),8) != 0) {
              uVar16 = 0xffffffffffffffff;
            }
            paVar23 = (aiVertexWeight *)operator_new__(uVar16);
            if (uVar21 != 0) {
              local_1510 = paVar23;
              do {
                aiVertexWeight::aiVertexWeight(local_1510);
                local_1510 = local_1510 + 1;
              } while (local_1510 != paVar23 + uVar21);
            }
            *(aiVertexWeight **)(lVar4 + 0x418) = paVar23;
            *(undefined4 *)(lVar4 + 0x404) = 0;
          }
        }
        for (s = 0; sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                       (vertexids), s < sVar15; s = s + 1) {
          pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
          pmVar2 = pmVar14->vertex;
          pvVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(vertexids,(ulong)s)
          ;
          name_1.data._1020_4_ = pmVar2[*pvVar22].skinid;
          if ((name_1.data._1020_4_ != 0xffffffff) && (name_1.data._1020_4_ != 0xfffffffe)) {
            name_1.data[0x3f8] = '\0';
            name_1.data[0x3f9] = '\0';
            name_1.data[0x3fa] = '\0';
            name_1.data[0x3fb] = '\0';
            while( true ) {
              bVar12 = false;
              if ((uint)name_1.data._1016_4_ < 4) {
                pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
                bVar12 = 0.0 < pmVar14->skin[(uint)name_1.data._1020_4_].weight
                               [(uint)name_1.data._1016_4_];
              }
              if (!bVar12) break;
              pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
              pmVar3 = pmVar14->bone;
              pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
              pcVar1 = pmVar3[pmVar14->skin[(uint)name_1.data._1020_4_].boneid
                              [(uint)name_1.data._1016_4_]].name;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1348,pcVar1,(allocator<char> *)((long)&pBone_1 + 7));
              aiString::aiString((aiString *)local_1324,&local_1348);
              std::__cxx11::string::~string((string *)&local_1348);
              std::allocator<char>::~allocator((allocator<char> *)((long)&pBone_1 + 7));
              for (k = 0; k < *(uint *)&faces_local[9].
                                        super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                        super__Vector_impl_data._M_start; k = k + 1) {
                bVar12 = aiString::operator==
                                   (*(aiString **)
                                     (&(faces_local[9].
                                        super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                        super__Vector_impl_data._M_finish)->mNumIndices +
                                     (ulong)k * 2),(aiString *)local_1324);
                if (bVar12) {
                  lVar4 = *(long *)(&(faces_local[9].
                                      super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                      super__Vector_impl_data._M_finish)->mNumIndices + (ulong)k * 2
                                   );
                  *(uint *)(*(long *)(lVar4 + 0x418) + (ulong)*(uint *)(lVar4 + 0x404) * 8) = s;
                  pmVar14 = M3DWrapper::operator->((M3DWrapper *)pMesh_local);
                  *(M3D_FLOAT *)(*(long *)(lVar4 + 0x418) + 4 + (ulong)*(uint *)(lVar4 + 0x404) * 8)
                       = pmVar14->skin[(uint)name_1.data._1020_4_].weight
                         [(uint)name_1.data._1016_4_];
                  *(int *)(lVar4 + 0x404) = *(int *)(lVar4 + 0x404) + 1;
                  break;
                }
              }
              name_1.data._1016_4_ = name_1.data._1016_4_ + 1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void M3DImporter::populateMesh(const M3DWrapper &m3d, aiMesh *pMesh, std::vector<aiFace> *faces, std::vector<aiVector3D> *vertices,
		std::vector<aiVector3D> *normals, std::vector<aiVector3D> *texcoords, std::vector<aiColor4D> *colors,
		std::vector<unsigned int> *vertexids) {

	ai_assert(pMesh != nullptr);
	ai_assert(faces != nullptr);
	ai_assert(vertices != nullptr);
	ai_assert(normals != nullptr);
	ai_assert(texcoords != nullptr);
	ai_assert(colors != nullptr);
	ai_assert(vertexids != nullptr);
	ai_assert(m3d);

	ASSIMP_LOG_DEBUG_F("M3D: populateMesh numvertices ", vertices->size(), " numfaces ", faces->size(),
			" numnormals ", normals->size(), " numtexcoord ", texcoords->size(), " numbones ", m3d->numbone);

	if (vertices->size() && faces->size()) {
		pMesh->mNumFaces = static_cast<unsigned int>(faces->size());
		pMesh->mFaces = new aiFace[pMesh->mNumFaces];
		std::copy(faces->begin(), faces->end(), pMesh->mFaces);
		pMesh->mNumVertices = static_cast<unsigned int>(vertices->size());
		pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
		std::copy(vertices->begin(), vertices->end(), pMesh->mVertices);
		if (normals->size() == vertices->size()) {
			pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
			std::copy(normals->begin(), normals->end(), pMesh->mNormals);
		}
		if (texcoords->size() == vertices->size()) {
			pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
			std::copy(texcoords->begin(), texcoords->end(), pMesh->mTextureCoords[0]);
			pMesh->mNumUVComponents[0] = 2;
		}
		if (colors->size() == vertices->size()) {
			pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
			std::copy(colors->begin(), colors->end(), pMesh->mColors[0]);
		}
		// this is complicated, because M3D stores a list of bone id / weight pairs per
		// vertex but assimp uses lists of local vertex id/weight pairs per local bone list
		pMesh->mNumBones = m3d->numbone;
		/* we need aiBone with mOffsetMatrix for bones without weights as well */
		if (pMesh->mNumBones) {
			pMesh->mBones = new aiBone *[pMesh->mNumBones];
			for (unsigned int i = 0; i < m3d->numbone; i++) {
				aiNode *pNode;
				pMesh->mBones[i] = new aiBone;
				pMesh->mBones[i]->mName = aiString(std::string(m3d->bone[i].name));
				pMesh->mBones[i]->mNumWeights = 0;
				pNode = findNode(mScene->mRootNode, pMesh->mBones[i]->mName);
				if (pNode) {
					calculateOffsetMatrix(pNode, &pMesh->mBones[i]->mOffsetMatrix);
					pMesh->mBones[i]->mOffsetMatrix.Inverse();
				} else
					pMesh->mBones[i]->mOffsetMatrix = aiMatrix4x4();
			}
			if (vertexids->size()) {
				unsigned int i, j;
				// first count how many vertices we have per bone
				for (i = 0; i < vertexids->size(); i++) {
					unsigned int s = m3d->vertex[vertexids->at(i)].skinid;
					if (s != M3D_UNDEF && s != M3D_INDEXMAX) {
						for (unsigned int k = 0; k < M3D_NUMBONE && m3d->skin[s].weight[k] > 0.0; k++) {
							aiString name = aiString(std::string(m3d->bone[m3d->skin[s].boneid[k]].name));
							for (j = 0; j < pMesh->mNumBones; j++) {
								if (pMesh->mBones[j]->mName == name) {
									pMesh->mBones[j]->mNumWeights++;
									break;
								}
							}
						}
					}
				}
				// allocate mWeights
				for (j = 0; j < pMesh->mNumBones; j++) {
					aiBone *pBone = pMesh->mBones[j];
					if (pBone->mNumWeights) {
						pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
						pBone->mNumWeights = 0;
					}
				}
				// fill up with data
				for (i = 0; i < vertexids->size(); i++) {
					unsigned int s = m3d->vertex[vertexids->at(i)].skinid;
					if (s != M3D_UNDEF && s != M3D_INDEXMAX) {
						for (unsigned int k = 0; k < M3D_NUMBONE && m3d->skin[s].weight[k] > 0.0; k++) {
							aiString name = aiString(std::string(m3d->bone[m3d->skin[s].boneid[k]].name));
							for (j = 0; j < pMesh->mNumBones; j++) {
								if (pMesh->mBones[j]->mName == name) {
									aiBone *pBone = pMesh->mBones[j];
									pBone->mWeights[pBone->mNumWeights].mVertexId = i;
									pBone->mWeights[pBone->mNumWeights].mWeight = m3d->skin[s].weight[k];
									pBone->mNumWeights++;
									break;
								}
							}
						} // foreach skin
					}
				} // foreach vertexids
			}
		}
	}
}